

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::NewFrame(void)

{
  int *piVar1;
  ImDrawList *this;
  float *pfVar2;
  ImGuiID IVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  undefined1 auVar6 [12];
  byte bVar7;
  int i;
  int iVar8;
  ImGuiTextBuffer *this_00;
  char *pcVar9;
  ImVec2 IVar10;
  ImFontAtlas *pIVar11;
  ImGuiWindow *pIVar12;
  ImGuiWindow *pIVar13;
  ulong uVar14;
  ImGuiWindow **__dest;
  ImGuiPopupRef *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  char cVar18;
  ImGuiID IVar19;
  long lVar20;
  ulong uVar21;
  int m;
  ImGuiWindow **ppIVar22;
  ulong uVar23;
  ImGuiPopupRef *pIVar24;
  uint uVar25;
  char *pcVar26;
  char *pcVar27;
  bool bVar28;
  uint uVar29;
  float fVar30;
  ImVec2 IVar31;
  undefined1 auVar32 [16];
  ImVec2 IVar33;
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 uVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float y;
  int file_size;
  char name [64];
  float local_a4;
  int local_a0;
  int local_9c;
  ImVec2 local_98;
  undefined8 uStack_90;
  char *local_88;
  ImGuiContext *local_80;
  ImVec2 local_78 [9];
  
  pIVar17 = GImGui;
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x825,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || (uVar36 = 0, (GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x826,"void ImGui::NewFrame()");
  }
  pIVar11 = (GImGui->IO).Fonts;
  if ((pIVar11->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x827,"void ImGui::NewFrame()");
  }
  if ((*(pIVar11->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x828,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x829,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    this_00 = (ImGuiTextBuffer *)(*(pIVar17->IO).MemAllocFn)(0x10);
    pIVar17->LogClipboard = this_00;
    uVar36 = extraout_XMM1_Qb;
    ImGuiTextBuffer::ImGuiTextBuffer(this_00);
    if ((pIVar17->Settings).Size != 0) {
      __assert_fail("g.Settings.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x831,"void ImGui::NewFrame()");
    }
    local_80 = GImGui;
    pcVar9 = (GImGui->IO).IniFilename;
    if ((pcVar9 != (char *)0x0) &&
       (pcVar9 = (char *)ImLoadFileToMemory(pcVar9,"rb",&local_9c,1), local_88 = pcVar9,
       pcVar9 != (char *)0x0)) {
      if (0 < (long)local_9c) {
        pcVar26 = pcVar9 + local_9c;
        IVar10.x = 0.0;
        IVar10.y = 0.0;
        pcVar27 = pcVar9;
LAB_00130a20:
        do {
          if ((*pcVar9 != '\n') && (*pcVar9 != '\r')) {
            pcVar9 = pcVar9 + 1;
            if (pcVar9 < pcVar26) goto LAB_00130a20;
          }
          if (((pcVar27 < pcVar9) && (*pcVar27 == '[')) && (pcVar9[-1] == ']')) {
            ImFormatString((char *)local_78,0x40,"%.*s",(ulong)(((int)pcVar9 - (int)pcVar27) - 2),
                           pcVar27 + 1);
            IVar10 = (ImVec2)FindWindowSettings((char *)local_78);
            if (IVar10 == (ImVec2)0x0) {
              IVar10 = (ImVec2)AddWindowSettings((char *)local_78);
            }
          }
          else if (IVar10 == (ImVec2)0x0) {
            IVar10.x = 0.0;
            IVar10.y = 0.0;
          }
          else {
            local_98 = IVar10;
            iVar8 = __isoc99_sscanf(pcVar27,"Pos=%f,%f",local_78);
            if (iVar8 == 2) {
              ((ImVec2 *)((long)local_98 + 0xc))->x = local_78[0].x;
              *(float *)((long)local_98 + 0x10) = local_a4;
              IVar10 = local_98;
            }
            else {
              iVar8 = __isoc99_sscanf(pcVar27,"Size=%f,%f",local_78,&local_a4);
              if (iVar8 == 2) {
                IVar10 = (local_80->Style).WindowMinSize;
                fVar37 = IVar10.x;
                fVar30 = IVar10.y;
                uVar25 = -(uint)(fVar37 <= local_78[0].x);
                uVar29 = -(uint)(fVar30 <= local_a4);
                *(ulong *)((long)local_98 + 0x14) =
                     CONCAT44(~uVar29 & (uint)fVar30,~uVar25 & (uint)fVar37) |
                     CONCAT44((uint)local_a4 & uVar29,(uint)local_78[0].x & uVar25);
                IVar10 = local_98;
              }
              else {
                iVar8 = __isoc99_sscanf(pcVar27,"Collapsed=%d",&local_a0);
                IVar10 = local_98;
                if (iVar8 == 1) {
                  *(bool *)((long)local_98 + 0x1c) = local_a0 != 0;
                }
              }
            }
          }
          pcVar9 = pcVar9 + 1;
          pcVar27 = pcVar9;
        } while (pcVar9 < pcVar26);
      }
      pIVar16 = GImGui;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
      (*(pIVar16->IO).MemFreeFn)(local_88);
      uVar36 = extraout_XMM1_Qb_00;
    }
    pIVar17->Initialized = true;
    pIVar11 = (pIVar17->IO).Fonts;
    if ((pIVar11->Fonts).Size < 1) {
      pcVar9 = "value_type &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_00131817:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                    ,0x353,pcVar9);
    }
  }
  SetCurrentFont(*(pIVar11->Fonts).Data);
  pIVar17->Time = (pIVar17->IO).DeltaTime + pIVar17->Time;
  pIVar17->FrameCount = pIVar17->FrameCount + 1;
  pIVar17->Tooltip[0] = '\0';
  this = &pIVar17->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,&((pIVar17->IO).Fonts)->TexID);
  auVar6._4_8_ = uVar36;
  auVar6._0_4_ = GNullClipRect.y;
  auVar35._0_8_ = auVar6._0_8_ << 0x20;
  auVar35._8_4_ = GNullClipRect.z;
  auVar35._12_4_ = GNullClipRect.w;
  ImDrawList::PushClipRect(this,GNullClipRect._0_8_,auVar35._8_8_,false);
  (pIVar17->RenderDrawData).Valid = false;
  (pIVar17->RenderDrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar17->RenderDrawData).CmdListsCount = 0;
  (pIVar17->RenderDrawData).TotalVtxCount = 0;
  (pIVar17->RenderDrawData).TotalIdxCount = 0;
  fVar37 = (pIVar17->IO).MousePos.x;
  if ((0.0 <= fVar37) || (pfVar2 = &(pIVar17->IO).MousePos.y, 0.0 < *pfVar2 || *pfVar2 == 0.0)) {
    if (fVar37 < 0.0) goto LAB_00130c60;
LAB_00130c6a:
    IVar10 = (pIVar17->IO).MousePosPrev;
    fVar30 = IVar10.x;
    fVar38 = IVar10.y;
    if ((fVar30 < 0.0) && (fVar38 < 0.0)) goto LAB_00130c87;
    IVar31.x = fVar37 - fVar30;
    IVar31.y = (pIVar17->IO).MousePos.y - fVar38;
    (pIVar17->IO).MouseDelta = IVar31;
  }
  else {
    (pIVar17->IO).MousePos.x = -9999.0;
    (pIVar17->IO).MousePos.y = -9999.0;
    fVar37 = -9999.0;
LAB_00130c60:
    pfVar2 = &(pIVar17->IO).MousePos.y;
    if (0.0 < *pfVar2 || *pfVar2 == 0.0) goto LAB_00130c6a;
LAB_00130c87:
    (pIVar17->IO).MouseDelta.x = 0.0;
    (pIVar17->IO).MouseDelta.y = 0.0;
  }
  IVar10 = (pIVar17->IO).MousePos;
  (pIVar17->IO).MousePosPrev = IVar10;
  lVar20 = 0;
  do {
    if ((pIVar17->IO).MouseDown[lVar20] == true) {
      fVar37 = (pIVar17->IO).MouseDownDuration[lVar20];
      (pIVar17->IO).MouseClicked[lVar20] = fVar37 < 0.0;
      (pIVar17->IO).MouseReleased[lVar20] = false;
      (pIVar17->IO).MouseDownDurationPrev[lVar20] = fVar37;
      if (0.0 <= fVar37) {
        (pIVar17->IO).MouseDownDuration[lVar20] = fVar37 + (pIVar17->IO).DeltaTime;
        (pIVar17->IO).MouseDoubleClicked[lVar20] = false;
        fVar37 = (pIVar17->IO).MouseDragMaxDistanceSqr[lVar20];
        fVar30 = IVar10.x - (pIVar17->IO).MouseClickedPos[lVar20].x;
        fVar38 = IVar10.y - (pIVar17->IO).MouseClickedPos[lVar20].y;
        fVar30 = fVar30 * fVar30 + fVar38 * fVar38;
        uVar25 = -(uint)(fVar30 <= fVar37);
        (pIVar17->IO).MouseDragMaxDistanceSqr[lVar20] =
             (float)(uVar25 & (uint)fVar37 | ~uVar25 & (uint)fVar30);
      }
      else {
        (pIVar17->IO).MouseDownDuration[lVar20] = 0.0;
        (pIVar17->IO).MouseDoubleClicked[lVar20] = false;
        fVar37 = pIVar17->Time;
        if ((fVar37 - (pIVar17->IO).MouseClickedTime[lVar20] < (pIVar17->IO).MouseDoubleClickTime)
           && (fVar38 = IVar10.x - (pIVar17->IO).MouseClickedPos[lVar20].x,
              fVar39 = IVar10.y - (pIVar17->IO).MouseClickedPos[lVar20].y,
              fVar30 = (pIVar17->IO).MouseDoubleClickMaxDist, fVar37 = -3.4028235e+38,
              fVar38 * fVar38 + fVar39 * fVar39 < fVar30 * fVar30)) {
          (pIVar17->IO).MouseDoubleClicked[lVar20] = true;
          fVar37 = -3.4028235e+38;
        }
        (pIVar17->IO).MouseClickedTime[lVar20] = fVar37;
        (pIVar17->IO).MouseClickedPos[lVar20] = IVar10;
        (pIVar17->IO).MouseDragMaxDistanceSqr[lVar20] = 0.0;
      }
    }
    else {
      (pIVar17->IO).MouseClicked[lVar20] = false;
      fVar37 = (pIVar17->IO).MouseDownDuration[lVar20];
      (pIVar17->IO).MouseReleased[lVar20] = 0.0 <= fVar37;
      (pIVar17->IO).MouseDownDurationPrev[lVar20] = fVar37;
      (pIVar17->IO).MouseDownDuration[lVar20] = -1.0;
      (pIVar17->IO).MouseDoubleClicked[lVar20] = false;
    }
    lVar20 = lVar20 + 1;
  } while (lVar20 != 5);
  pfVar2 = (pIVar17->IO).KeysDownDuration;
  memcpy((pIVar17->IO).KeysDownDurationPrev,pfVar2,0x800);
  lVar20 = 0;
  do {
    fVar37 = -1.0;
    if ((pIVar17->IO).KeysDown[lVar20] == true) {
      fVar37 = 0.0;
      if (0.0 <= pfVar2[lVar20]) {
        fVar37 = pfVar2[lVar20] + (pIVar17->IO).DeltaTime;
      }
    }
    pfVar2[lVar20] = fVar37;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x200);
  fVar37 = (pIVar17->IO).DeltaTime;
  iVar8 = pIVar17->FramerateSecPerFrameIdx;
  pIVar17->FramerateSecPerFrameAccum =
       (fVar37 - pIVar17->FramerateSecPerFrame[iVar8]) + pIVar17->FramerateSecPerFrameAccum;
  pIVar17->FramerateSecPerFrame[iVar8] = fVar37;
  pIVar17->FramerateSecPerFrameIdx = (iVar8 + 1) % 10;
  (pIVar17->IO).Framerate = 1.0 / (pIVar17->FramerateSecPerFrameAccum / 10.0);
  pIVar17->HoveredIdPreviousFrame = pIVar17->HoveredId;
  pIVar17->HoveredId = 0;
  pIVar17->HoveredIdAllowOverlap = false;
  pIVar16 = GImGui;
  if ((pIVar17->ActiveIdIsAlive == false) &&
     (pIVar17->ActiveId != 0 && pIVar17->ActiveIdPreviousFrame == pIVar17->ActiveId)) {
    GImGui->ActiveId = 0;
    pIVar16->ActiveIdIsJustActivated = true;
    pIVar16->ActiveIdAllowOverlap = false;
    pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar3 = pIVar17->ActiveId;
  IVar19 = pIVar17->MovedWindowMoveId;
  pIVar17->ActiveIdPreviousFrame = IVar3;
  pIVar17->ActiveIdIsAlive = false;
  pIVar16 = GImGui;
  pIVar17->ActiveIdIsJustActivated = false;
  if (IVar19 == IVar3 && IVar19 != 0) {
    if (GImGui->ActiveId == IVar3) {
      GImGui->ActiveIdIsAlive = true;
    }
    pIVar12 = pIVar17->MovedWindow;
    if ((pIVar12 == (ImGuiWindow *)0x0) || (pIVar12->RootWindow == (ImGuiWindow *)0x0)) {
      __assert_fail("g.MovedWindow && g.MovedWindow->RootWindow",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x87f,"void ImGui::NewFrame()");
    }
    if (pIVar12->RootWindow->MoveId != IVar3) {
      __assert_fail("g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                    ,0x880,"void ImGui::NewFrame()");
    }
    if ((pIVar17->IO).MouseDown[0] == true) {
      if ((((pIVar12->Flags & 4U) == 0) &&
          (IVar10 = (pIVar17->IO).MouseDelta, IVar33.x = (pIVar12->PosFloat).x + IVar10.x,
          IVar33.y = (pIVar12->PosFloat).y + IVar10.y, pIVar12->PosFloat = IVar33,
          ((uint)pIVar12->Flags >> 8 & 1) == 0)) && (pIVar16->SettingsDirtyTimer <= 0.0)) {
        pIVar16->SettingsDirtyTimer = (pIVar16->IO).IniSavingRate;
      }
      FocusWindow(pIVar12);
    }
    else {
      pIVar16->ActiveId = 0;
      pIVar16->ActiveIdIsJustActivated = true;
      pIVar16->ActiveIdAllowOverlap = false;
      pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar17->MovedWindow = (ImGuiWindow *)0x0;
      pIVar17->MovedWindowMoveId = 0;
    }
  }
  else {
    pIVar17->MovedWindow = (ImGuiWindow *)0x0;
    pIVar17->MovedWindowMoveId = 0;
  }
  if ((0.0 < pIVar17->SettingsDirtyTimer) &&
     (fVar37 = pIVar17->SettingsDirtyTimer - (pIVar17->IO).DeltaTime,
     pIVar17->SettingsDirtyTimer = fVar37, fVar37 <= 0.0)) {
    SaveSettings();
  }
  pIVar12 = pIVar17->MovedWindow;
  if (pIVar12 == (ImGuiWindow *)0x0) {
    local_98 = (pIVar17->IO).MousePos;
    uStack_90 = 0;
    pIVar12 = FindHoveredWindow(local_98,false);
    pIVar17->HoveredWindow = pIVar12;
    if ((pIVar12 != (ImGuiWindow *)0x0) && ((pIVar12->Flags & 0x100000) != 0)) goto LAB_001310f1;
    pIVar13 = FindHoveredWindow(local_98,true);
  }
  else {
    pIVar17->HoveredWindow = pIVar12;
LAB_001310f1:
    pIVar13 = pIVar12->RootWindow;
  }
  pIVar17->HoveredRootWindow = pIVar13;
  pIVar13 = GetFrontMostModalRootWindow();
  if (pIVar13 == (ImGuiWindow *)0x0) {
    pIVar17->ModalWindowDarkeningRatio = 0.0;
  }
  else {
    fVar37 = (pIVar17->IO).DeltaTime * 6.0 + pIVar17->ModalWindowDarkeningRatio;
    if (1.0 <= fVar37) {
      fVar37 = 1.0;
    }
    pIVar17->ModalWindowDarkeningRatio = fVar37;
    ppIVar22 = &pIVar17->HoveredRootWindow;
    do {
      pIVar5 = *ppIVar22;
      if (pIVar5 == (ImGuiWindow *)0x0) break;
      ppIVar22 = &pIVar5->ParentWindow;
    } while (pIVar5 != pIVar13);
    if (pIVar5 == (ImGuiWindow *)0x0) {
      pIVar12 = (ImGuiWindow *)0x0;
      pIVar17->HoveredWindow = (ImGuiWindow *)0x0;
      pIVar17->HoveredRootWindow = (ImGuiWindow *)0x0;
    }
  }
  iVar8 = -1;
  lVar20 = 0;
  bVar7 = 0;
  do {
    if ((pIVar17->IO).MouseClicked[lVar20] == true) {
      bVar28 = true;
      if (pIVar12 == (ImGuiWindow *)0x0) {
        bVar28 = (pIVar17->OpenPopupStack).Size != 0;
      }
      (pIVar17->IO).MouseDownOwned[lVar20] = bVar28;
    }
    bVar28 = (pIVar17->IO).MouseDown[lVar20];
    if ((bVar28 == true) &&
       ((iVar8 == -1 ||
        (fVar37 = (pIVar17->IO).MouseClickedTime[iVar8],
        pfVar2 = (pIVar17->IO).MouseClickedTime + lVar20, *pfVar2 <= fVar37 && fVar37 != *pfVar2))))
    {
      iVar8 = (int)lVar20;
    }
    bVar7 = bVar7 & 1 | bVar28;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 5);
  if (iVar8 == -1) {
    iVar8 = pIVar17->CaptureMouseNextFrame;
    cVar18 = '\x01';
    if (iVar8 == -1) {
LAB_00131254:
      cVar18 = '\x01';
      bVar28 = true;
      if ((pIVar12 == (ImGuiWindow *)0x0) && (bVar7 == 0)) goto LAB_00131261;
      goto LAB_00131278;
    }
LAB_00131248:
    (pIVar17->IO).WantCaptureMouse = iVar8 != 0;
  }
  else {
    cVar18 = (pIVar17->IO).MouseDownOwned[iVar8];
    iVar8 = pIVar17->CaptureMouseNextFrame;
    if (iVar8 != -1) goto LAB_00131248;
    if ((bool)cVar18 != false) goto LAB_00131254;
    cVar18 = '\0';
LAB_00131261:
    bVar28 = true;
    if (pIVar17->ActiveId == 0) {
      bVar28 = (pIVar17->OpenPopupStack).Size != 0;
    }
LAB_00131278:
    (pIVar17->IO).WantCaptureMouse = bVar28;
  }
  IVar3 = pIVar17->ActiveId;
  IVar19 = pIVar17->CaptureKeyboardNextFrame;
  if (pIVar17->CaptureKeyboardNextFrame == 0xffffffff) {
    IVar19 = IVar3;
  }
  (pIVar17->IO).WantCaptureKeyboard = IVar19 != 0;
  if (IVar3 == 0) {
    bVar28 = false;
  }
  else {
    bVar28 = (pIVar17->InputTextState).Id == IVar3;
  }
  (pIVar17->IO).WantTextInput = bVar28;
  pIVar17->MouseCursor = 0;
  pIVar17->CaptureMouseNextFrame = -1;
  pIVar17->CaptureKeyboardNextFrame = -1;
  (pIVar17->OsImePosRequest).x = 1.0;
  (pIVar17->OsImePosRequest).y = 1.0;
  if (cVar18 == '\0') {
    pIVar17->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar17->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  else {
    pIVar12 = pIVar17->HoveredWindow;
    if (pIVar12 != (ImGuiWindow *)0x0) {
      fVar37 = (pIVar17->IO).MouseWheel;
      if (((fVar37 != 0.0) || (NAN(fVar37))) && (pIVar12->Collapsed == false)) {
        if ((pIVar17->IO).KeyCtrl == true) {
          if ((pIVar17->IO).FontAllowUserScaling == true) {
            fVar30 = fVar37 * 0.1 + pIVar12->FontWindowScale;
            fVar37 = 2.5;
            if (fVar30 <= 2.5) {
              fVar37 = fVar30;
            }
            fVar37 = (float)(-(uint)(fVar30 < 0.5) & 0x3f000000 |
                            ~-(uint)(fVar30 < 0.5) & (uint)fVar37);
            fVar38 = fVar37 / pIVar12->FontWindowScale;
            pIVar12->FontWindowScale = fVar37;
            fVar37 = 1.0 - fVar38;
            IVar10 = pIVar12->Size;
            auVar32._8_8_ = 0;
            auVar32._0_4_ = IVar10.x;
            auVar32._4_4_ = IVar10.y;
            IVar31 = (pIVar17->IO).MousePos;
            auVar34._0_4_ = (IVar31.x - (pIVar12->Pos).x) * fVar37 * IVar10.x;
            auVar34._4_4_ = (IVar31.y - (pIVar12->Pos).y) * fVar37 * IVar10.y;
            auVar34._8_4_ = fVar37 * 0.0 * 0.0;
            auVar34._12_4_ = fVar37 * 0.0 * 0.0;
            auVar35 = divps(auVar34,auVar32);
            fVar37 = (pIVar12->Pos).x;
            fVar30 = (pIVar12->Pos).y;
            (pIVar12->PosFloat).x = (pIVar12->PosFloat).x + auVar35._0_4_;
            (pIVar12->PosFloat).y = (pIVar12->PosFloat).y + auVar35._4_4_;
            (pIVar12->Pos).x = fVar37 + auVar35._0_4_;
            (pIVar12->Pos).y = fVar30 + auVar35._4_4_;
            fVar37 = (pIVar12->SizeFull).x;
            fVar30 = (pIVar12->SizeFull).y;
            (pIVar12->Size).x = fVar38 * (pIVar12->Size).x;
            (pIVar12->Size).y = fVar38 * (pIVar12->Size).y;
            (pIVar12->SizeFull).x = fVar38 * fVar37;
            (pIVar12->SizeFull).y = fVar38 * fVar30;
          }
        }
        else if ((pIVar12->Flags & 0x10U) == 0) {
          fVar30 = (pIVar12->Scroll).y;
          fVar38 = (pIVar12->DC).CursorMaxPos.y;
          fVar37 = fVar30 - GImGui->FontBaseSize * pIVar12->FontWindowScale * fVar37 *
                            (float)(byte)((((uint)pIVar12->Flags >> 0x17 & 1) == 0) * '\x02' + 3);
          (pIVar12->Scroll).y = fVar37;
          (pIVar12->DC).CursorMaxPos.y = (fVar30 + fVar38) - fVar37;
        }
      }
    }
  }
  if (((IVar3 == 0) && (pIVar17->FocusedWindow != (ImGuiWindow *)0x0)) &&
     ((pIVar17->FocusedWindow->Active == true &&
      (bVar28 = IsKeyPressed((GImGui->IO).KeyMap[0],false), bVar28)))) {
    pIVar17->FocusedWindow->FocusIdxTabRequestNext = 0;
  }
  uVar25 = (pIVar17->Windows).Size;
  uVar14 = (ulong)uVar25;
  if (uVar14 != 0) {
    uVar21 = 0;
    if (0 < (int)uVar25) {
      uVar21 = (ulong)uVar25;
    }
    uVar23 = 0;
    do {
      if (uVar21 == uVar23) {
        pcVar9 = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_00131817;
      }
      pIVar12 = (pIVar17->Windows).Data[uVar23];
      pIVar12->WasActive = pIVar12->Active;
      pIVar12->Active = false;
      pIVar12->Accessed = false;
      uVar23 = uVar23 + 1;
    } while (uVar14 != uVar23);
  }
  if (((pIVar17->FocusedWindow != (ImGuiWindow *)0x0) && (0 < (int)uVar25)) &&
     (pIVar17->FocusedWindow->WasActive == false)) {
    uVar14 = uVar14 + 1;
    do {
      pIVar12 = (pIVar17->Windows).Data[uVar14 - 2];
      if ((pIVar12->WasActive == true) && ((pIVar12->Flags & 0x100000) == 0)) {
        FocusWindow(pIVar12);
        break;
      }
      uVar14 = uVar14 - 1;
    } while (1 < uVar14);
  }
  pIVar16 = GImGui;
  if ((pIVar17->CurrentWindowStack).Capacity < 0) {
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiWindow **)(*(pIVar16->IO).MemAllocFn)(0);
    ppIVar22 = (pIVar17->CurrentWindowStack).Data;
    if (ppIVar22 == (ImGuiWindow **)0x0) {
LAB_0013152a:
      ppIVar22 = (ImGuiWindow **)0x0;
      pIVar16 = GImGui;
    }
    else {
      memcpy(__dest,ppIVar22,(long)(pIVar17->CurrentWindowStack).Size << 3);
      pIVar16 = GImGui;
      ppIVar22 = (pIVar17->CurrentWindowStack).Data;
      if (ppIVar22 == (ImGuiWindow **)0x0) goto LAB_0013152a;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar16->IO).MemFreeFn)(ppIVar22);
    (pIVar17->CurrentWindowStack).Data = __dest;
    (pIVar17->CurrentWindowStack).Capacity = 0;
  }
  pIVar16 = GImGui;
  (pIVar17->CurrentWindowStack).Size = 0;
  if ((pIVar17->CurrentPopupStack).Capacity < 0) {
    piVar1 = &(pIVar16->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar15 = (ImGuiPopupRef *)(*(pIVar16->IO).MemAllocFn)(0);
    pIVar24 = (pIVar17->CurrentPopupStack).Data;
    if (pIVar24 == (ImGuiPopupRef *)0x0) {
LAB_001315b8:
      pIVar24 = (ImGuiPopupRef *)0x0;
      pIVar16 = GImGui;
    }
    else {
      memcpy(pIVar15,pIVar24,(long)(pIVar17->CurrentPopupStack).Size * 0x28);
      pIVar16 = GImGui;
      pIVar24 = (pIVar17->CurrentPopupStack).Data;
      if (pIVar24 == (ImGuiPopupRef *)0x0) goto LAB_001315b8;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar16->IO).MemFreeFn)(pIVar24);
    (pIVar17->CurrentPopupStack).Data = pIVar15;
    (pIVar17->CurrentPopupStack).Capacity = 0;
    pIVar16 = GImGui;
  }
  (pIVar17->CurrentPopupStack).Size = 0;
  uVar25 = (pIVar16->OpenPopupStack).Size;
  uVar14 = (ulong)uVar25;
  if (uVar14 == 0) goto LAB_0013174c;
  uVar21 = 0;
  if (0 < (int)uVar25 && pIVar16->FocusedWindow != (ImGuiWindow *)0x0) {
    pIVar24 = (pIVar16->OpenPopupStack).Data;
    uVar21 = 0;
LAB_00131619:
    pIVar12 = pIVar24[uVar21].Window;
    if (pIVar12 != (ImGuiWindow *)0x0) {
      if (((uint)pIVar12->Flags >> 0x19 & 1) == 0) {
        __assert_fail("(popup.Window->Flags & ImGuiWindowFlags_Popup) != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                      ,0xd55,"void CloseInactivePopups()");
      }
      uVar23 = uVar21;
      if (((uint)pIVar12->Flags >> 0x14 & 1) == 0) {
        do {
          if (pIVar12 == (ImGuiWindow *)0x0) {
            if (uVar14 <= uVar23 + 1) goto LAB_00131684;
          }
          else {
            pIVar13 = pIVar16->FocusedWindow->RootWindow;
            if ((uVar14 <= uVar23 + 1) || (pIVar12->RootWindow == pIVar13)) goto LAB_00131672;
          }
          pIVar12 = pIVar24[uVar23 + 1].Window;
          uVar23 = uVar23 + 1;
        } while( true );
      }
    }
    goto LAB_00131677;
  }
LAB_00131684:
  iVar8 = (int)uVar21;
  if ((int)uVar25 <= iVar8) goto LAB_0013174c;
  iVar4 = (pIVar16->OpenPopupStack).Capacity;
  pIVar17 = pIVar16;
  if (iVar4 < iVar8) {
    if (iVar4 == 0) {
      uVar25 = 8;
    }
    else {
      uVar25 = iVar4 / 2 + iVar4;
    }
    uVar14 = (ulong)uVar25;
    if ((int)uVar25 <= iVar8) {
      uVar14 = uVar21 & 0xffffffff;
    }
    piVar1 = &(pIVar16->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    pIVar15 = (ImGuiPopupRef *)(*(pIVar16->IO).MemAllocFn)(uVar14 * 0x28);
    pIVar24 = (pIVar16->OpenPopupStack).Data;
    if (pIVar24 == (ImGuiPopupRef *)0x0) {
LAB_00131725:
      pIVar24 = (ImGuiPopupRef *)0x0;
      pIVar17 = GImGui;
    }
    else {
      memcpy(pIVar15,pIVar24,(long)(pIVar16->OpenPopupStack).Size * 0x28);
      pIVar17 = GImGui;
      pIVar24 = (pIVar16->OpenPopupStack).Data;
      if (pIVar24 == (ImGuiPopupRef *)0x0) goto LAB_00131725;
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(pIVar17->IO).MemFreeFn)(pIVar24);
    (pIVar16->OpenPopupStack).Data = pIVar15;
    (pIVar16->OpenPopupStack).Capacity = (int)uVar14;
    pIVar17 = GImGui;
  }
  (pIVar16->OpenPopupStack).Size = iVar8;
  pIVar16 = pIVar17;
LAB_0013174c:
  (pIVar16->SetNextWindowSizeVal).x = 400.0;
  (pIVar16->SetNextWindowSizeVal).y = 400.0;
  pIVar16->SetNextWindowSizeCond = 4;
  local_78[0].x = 0.0;
  local_78[0].y = 0.0;
  Begin("Debug",(bool *)0x0,local_78,-1.0,0);
  return;
LAB_00131672:
  if (pIVar12->RootWindow != pIVar13) goto LAB_00131684;
LAB_00131677:
  uVar21 = uVar21 + 1;
  if (uVar21 == uVar14) goto LAB_0013174c;
  goto LAB_00131619;
}

Assistant:

void ImGui::NewFrame()
{
    ImGuiContext& g = *GImGui;

    // Check user data
    IM_ASSERT(g.IO.DeltaTime >= 0.0f);               // Need a positive DeltaTime (zero is tolerated but will cause some timing issues)
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f);
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0);           // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded());     // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f);  // Invalid style setting

    if (!g.Initialized)
    {
        // Initialize on first frame
        g.LogClipboard = (ImGuiTextBuffer*)ImGui::MemAlloc(sizeof(ImGuiTextBuffer));
        IM_PLACEMENT_NEW(g.LogClipboard) ImGuiTextBuffer();

        IM_ASSERT(g.Settings.empty());
        LoadSettings();
        g.Initialized = true;
    }

    SetCurrentFont(g.IO.Fonts->Fonts[0]);

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.Tooltip[0] = '\0';
    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.RenderDrawData.Valid = false;
    g.RenderDrawData.CmdLists = NULL;
    g.RenderDrawData.CmdListsCount = g.RenderDrawData.TotalVtxCount = g.RenderDrawData.TotalIdxCount = 0;

    // Update inputs state
    if (g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0)
        g.IO.MousePos = ImVec2(-9999.0f, -9999.0f);
    if ((g.IO.MousePos.x < 0 && g.IO.MousePos.y < 0) || (g.IO.MousePosPrev.x < 0 && g.IO.MousePosPrev.y < 0))   // if mouse just appeared or disappeared (negative coordinate) we cancel out movement in MouseDelta
        g.IO.MouseDelta = ImVec2(0.0f, 0.0f);
    else
        g.IO.MouseDelta = g.IO.MousePos - g.IO.MousePosPrev;
    g.IO.MousePosPrev = g.IO.MousePos;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        g.IO.MouseClicked[i] = g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] < 0.0f;
        g.IO.MouseReleased[i] = !g.IO.MouseDown[i] && g.IO.MouseDownDuration[i] >= 0.0f;
        g.IO.MouseDownDurationPrev[i] = g.IO.MouseDownDuration[i];
        g.IO.MouseDownDuration[i] = g.IO.MouseDown[i] ? (g.IO.MouseDownDuration[i] < 0.0f ? 0.0f : g.IO.MouseDownDuration[i] + g.IO.DeltaTime) : -1.0f;
        g.IO.MouseDoubleClicked[i] = false;
        if (g.IO.MouseClicked[i])
        {
            if (g.Time - g.IO.MouseClickedTime[i] < g.IO.MouseDoubleClickTime)
            {
                if (ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]) < g.IO.MouseDoubleClickMaxDist * g.IO.MouseDoubleClickMaxDist)
                    g.IO.MouseDoubleClicked[i] = true;
                g.IO.MouseClickedTime[i] = -FLT_MAX;    // so the third click isn't turned into a double-click
            }
            else
            {
                g.IO.MouseClickedTime[i] = g.Time;
            }
            g.IO.MouseClickedPos[i] = g.IO.MousePos;
            g.IO.MouseDragMaxDistanceSqr[i] = 0.0f;
        }
        else if (g.IO.MouseDown[i])
        {
            g.IO.MouseDragMaxDistanceSqr[i] = ImMax(g.IO.MouseDragMaxDistanceSqr[i], ImLengthSqr(g.IO.MousePos - g.IO.MouseClickedPos[i]));
        }
    }
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = 1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame));

    // Clear reference to active widget if the widget isn't alive anymore
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        SetActiveID(0);
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;

    // Handle user moving window (at the beginning of the frame to avoid input lag or sheering). Only valid for root windows.
    if (g.MovedWindowMoveId && g.MovedWindowMoveId == g.ActiveId)
    {
        KeepAliveID(g.MovedWindowMoveId);
        IM_ASSERT(g.MovedWindow && g.MovedWindow->RootWindow);
        IM_ASSERT(g.MovedWindow->RootWindow->MoveId == g.MovedWindowMoveId);
        if (g.IO.MouseDown[0])
        {
            if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoMove))
            {
                g.MovedWindow->PosFloat += g.IO.MouseDelta;
                if (!(g.MovedWindow->Flags & ImGuiWindowFlags_NoSavedSettings))
                    MarkSettingsDirty();
            }
            FocusWindow(g.MovedWindow);
        }
        else
        {
            SetActiveID(0);
            g.MovedWindow = NULL;
            g.MovedWindowMoveId = 0;
        }
    }
    else
    {
        g.MovedWindow = NULL;
        g.MovedWindowMoveId = 0;
    }

    // Delay saving settings so we don't spam disk too much
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
            SaveSettings();
    }

    // Find the window we are hovering. Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow
    g.HoveredWindow = g.MovedWindow ? g.MovedWindow : FindHoveredWindow(g.IO.MousePos, false);
    if (g.HoveredWindow && (g.HoveredWindow->Flags & ImGuiWindowFlags_ChildWindow))
        g.HoveredRootWindow = g.HoveredWindow->RootWindow;
    else
        g.HoveredRootWindow = g.MovedWindow ? g.MovedWindow->RootWindow : FindHoveredWindow(g.IO.MousePos, true);

    if (ImGuiWindow* modal_window = GetFrontMostModalRootWindow())
    {
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
        ImGuiWindow* window = g.HoveredRootWindow;
        while (window && window != modal_window)
            window = window->ParentWindow;
        if (!window)
            g.HoveredRootWindow = g.HoveredWindow = NULL;
    }
    else
    {
        g.ModalWindowDarkeningRatio = 0.0f;
    }

    // Are we using inputs? Tell user so they can capture/discard the inputs away from the rest of their application.
    // When clicking outside of a window we assume the click is owned by the application and won't request capture. We need to track click ownership.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[mouse_earliest_button_down] > g.IO.MouseClickedTime[i])
                mouse_earliest_button_down = i;
    }
    bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];
    if (g.CaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.CaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.ActiveId != 0) || (!g.OpenPopupStack.empty());
    g.IO.WantCaptureKeyboard = (g.CaptureKeyboardNextFrame != -1) ? (g.CaptureKeyboardNextFrame != 0) : (g.ActiveId != 0);
    g.IO.WantTextInput = (g.ActiveId != 0 && g.InputTextState.Id == g.ActiveId);
    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.CaptureMouseNextFrame = g.CaptureKeyboardNextFrame = -1;
    g.OsImePosRequest = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    if (!mouse_avail_to_imgui)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Scale & Scrolling
    if (g.HoveredWindow && g.IO.MouseWheel != 0.0f && !g.HoveredWindow->Collapsed)
    {
        ImGuiWindow* window = g.HoveredWindow;
        if (g.IO.KeyCtrl)
        {
            if (g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->PosFloat += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
        }
        else if (!(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
        {
            // Scroll
            const int scroll_lines = (window->Flags & ImGuiWindowFlags_ComboBox) ? 3 : 5;
            SetWindowScrollY(window, window->Scroll.y - g.IO.MouseWheel * window->CalcFontSize() * scroll_lines);
        }
    }

    // Pressing TAB activate widget focus
    // NB: Don't discard FocusedWindow if it isn't active, so that a window that go on/off programatically won't lose its keyboard focus.
    if (g.ActiveId == 0 && g.FocusedWindow != NULL && g.FocusedWindow->Active && IsKeyPressedMap(ImGuiKey_Tab, false))
        g.FocusedWindow->FocusIdxTabRequestNext = 0;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->Accessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.FocusedWindow && !g.FocusedWindow->WasActive)
        for (int i = g.Windows.Size-1; i >= 0; i--)
            if (g.Windows[i]->WasActive && !(g.Windows[i]->Flags & ImGuiWindowFlags_ChildWindow))
            {
                FocusWindow(g.Windows[i]);
                break;
            }

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    CloseInactivePopups();

    // Create implicit window - we will only render it if the user has added something to it.
    ImGui::SetNextWindowSize(ImVec2(400,400), ImGuiSetCond_FirstUseEver);
    ImGui::Begin("Debug");
}